

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

char * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::AllocPagesInternal<false>
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,uint pageCount,
          PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> **pageSegment)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *address;
  
  if (this->isClosed == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x549,"(!isClosed)","!isClosed");
    if (!bVar2) goto LAB_00707aa0;
    *puVar3 = 0;
  }
  bVar2 = ValidThreadAccess(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x54a,"(this->ValidThreadAccess())",
                       "Page allocation should only be used by a single thread");
    if (!bVar2) goto LAB_00707aa0;
    *puVar3 = 0;
  }
  if (this->maxAllocPageCount < pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x54b,"(pageCount <= this->maxAllocPageCount)",
                       "pageCount <= this->maxAllocPageCount");
    if (!bVar2) goto LAB_00707aa0;
    *puVar3 = 0;
  }
  this->isUsed = true;
  SuspendIdleDecommit(this);
  address = TryAllocFreePages<false>(this,pageCount,pageSegment);
  if (address == (char *)0x0) {
    address = SnailAllocPages<false>(this,pageCount,pageSegment);
  }
  ResumeIdleDecommit(this);
  PageTracking::ReportAllocation((PageAllocator *)this,address,(ulong)(pageCount << 0xc));
  if (((ulong)pageCount * 0x1000 - 1 & (ulong)address) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x55b,"(TPageSegment::IsAllocationPageAligned(allocation, pageCount))",
                       "TPageSegment::IsAllocationPageAligned(allocation, pageCount)");
    if (!bVar2) {
LAB_00707aa0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return address;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::AllocPagesInternal(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!isClosed);
    ASSERT_THREAD();
    Assert(pageCount <= this->maxAllocPageCount);

    this->isUsed = true;

    SuspendIdleDecommit();
    char * allocation = TryAllocFreePages<notPageAligned>(pageCount, pageSegment);
    if (allocation == nullptr)
    {
        allocation = SnailAllocPages<notPageAligned>(pageCount, pageSegment);
    }
    ResumeIdleDecommit();

    PageTracking::ReportAllocation((PageAllocator*)this, allocation, AutoSystemInfo::PageSize * pageCount);

    if (!notPageAligned)
    {
        Assert(TPageSegment::IsAllocationPageAligned(allocation, pageCount));
    }

    return allocation;
}